

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O1

float __thiscall btVectorX<float>::nrm2(btVectorX<float> *this)

{
  uint uVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  uVar1 = (this->m_storage).m_size;
  if ((ulong)uVar1 != 1) {
    if ((int)uVar1 < 1) {
      fVar3 = 1.0;
      fVar5 = 0.0;
    }
    else {
      uVar2 = 0;
      fVar5 = 0.0;
      fVar3 = 1.0;
      do {
        fVar4 = (this->m_storage).m_data[uVar2];
        if ((fVar4 != 0.0) || (NAN(fVar4))) {
          fVar4 = ABS(fVar4);
          if (fVar4 <= fVar5) {
            fVar3 = fVar3 + (fVar4 / fVar5) * (fVar4 / fVar5);
          }
          else {
            fVar3 = fVar3 * (fVar5 / fVar4) * (fVar5 / fVar4) + 1.0;
            fVar5 = fVar4;
          }
        }
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
    }
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    return fVar5 * fVar3;
  }
  return ABS(*(this->m_storage).m_data);
}

Assistant:

SIMD_FORCE_INLINE	int size() const
		{	
			return m_size;
		}